

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O1

void initializeContainerNetwork(Container *container)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_type *psVar2;
  pointer pcVar3;
  char cVar4;
  Verbosity VVar5;
  int iVar6;
  sem_t *__sem;
  long *plVar7;
  long *plVar8;
  runtime_error *prVar9;
  size_type *psVar10;
  long *plVar11;
  size_type *psVar12;
  size_type *psVar13;
  undefined8 uVar14;
  long lVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_368 [8];
  string suffix;
  long local_338;
  long lStack_330;
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  _Alloc_hider local_288;
  string broadcast;
  long local_258;
  size_type sStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198 [2];
  undefined1 local_188 [8];
  string newNetworkNs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  vEthPair;
  string command;
  string containerIp;
  string bridgeFilePath;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  allocator_type local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  value_type local_68;
  undefined1 *local_48;
  sem_t *local_38;
  
  VVar5 = loguru::current_verbosity_cutoff();
  if (-1 < VVar5) {
    loguru::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  __sem = sem_open("/networkNsSemaphore",0);
  if (__sem == (sem_t *)0x0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&vEthPair.first._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"/networkNsSemaphore","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffd78,"sem_open failed for ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::runtime_error::runtime_error(prVar9,(string *)&stack0xfffffffffffffd78);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38 = sem_open("/networkInitSemaphore",0);
  if (local_38 == (sem_t *)0x0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&vEthPair.first._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"/networkInitSemaphore","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffd78,"sem_open failed for ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::runtime_error::runtime_error(prVar9,(string *)&stack0xfffffffffffffd78);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_188 = (undefined1  [8])&newNetworkNs._M_string_length;
  pcVar3 = (container->id)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_188,pcVar3,pcVar3 + (container->id)._M_string_length);
  std::__cxx11::string::substr((ulong)local_368,(ulong)&container->id);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"veth0@",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&command.field_2 + 8),"veth1@",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
  local_288._M_p = (pointer)&broadcast._M_string_length;
  psVar10 = &vEthPair.first._M_string_length;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)psVar10) {
    broadcast.field_2._M_allocated_capacity = vEthPair.first.field_2._M_allocated_capacity;
  }
  else {
    local_288._M_p =
         (pointer)commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  broadcast._M_string_length =
       CONCAT71(vEthPair.first._M_string_length._1_7_,(undefined1)vEthPair.first._M_string_length);
  local_48 = (undefined1 *)((long)&broadcast.field_2 + 8);
  broadcast._M_dataplus = vEthPair.first._M_dataplus;
  vEthPair.first._M_dataplus._M_p = (pointer)0x0;
  vEthPair.first._M_string_length._0_1_ = 0;
  if ((size_type *)command.field_2._8_8_ == &containerIp._M_string_length) {
    sStack_250 = containerIp.field_2._M_allocated_capacity;
    broadcast.field_2._8_8_ = &local_258;
  }
  else {
    broadcast.field_2._8_8_ = command.field_2._8_8_;
  }
  local_258 = CONCAT71(containerIp._M_string_length._1_7_,(undefined1)containerIp._M_string_length);
  containerIp._M_dataplus._M_p = (pointer)0x0;
  containerIp._M_string_length._0_1_ = 0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar10;
  command.field_2._8_8_ = &containerIp._M_string_length;
  std::__cxx11::string::operator=((string *)&container->vEthPair,(string *)&stack0xfffffffffffffd78)
  ;
  std::__cxx11::string::operator=
            ((string *)&(container->vEthPair).second,(string *)(broadcast.field_2._M_local_buf + 8))
  ;
  if ((long *)broadcast.field_2._8_8_ != &local_258) {
    operator_delete((void *)broadcast.field_2._8_8_,local_258 + 1);
  }
  if ((size_type *)local_288._M_p != &broadcast._M_string_length) {
    operator_delete(local_288._M_p,broadcast._M_string_length + 1);
  }
  if ((size_type *)command.field_2._8_8_ != &containerIp._M_string_length) {
    operator_delete((void *)command.field_2._8_8_,
                    CONCAT71(containerIp._M_string_length._1_7_,
                             (undefined1)containerIp._M_string_length) + 1);
  }
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pointer)&vEthPair.first._M_string_length) {
    operator_delete(commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    CONCAT71(vEthPair.first._M_string_length._1_7_,
                             (undefined1)vEthPair.first._M_string_length) + 1);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&commands.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,&container->vEthPair);
  getContainerVEthIp_abi_cxx11_();
  if (containerIp._M_dataplus._M_p == (pointer)0x0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"Obtain IPv4 address for container: FAILED");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  VVar5 = loguru::current_verbosity_cutoff();
  if (-1 < VVar5) {
    loguru::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffd78,"ip netns add ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
  iVar6 = system(local_288._M_p);
  if ((size_type *)local_288._M_p != &broadcast._M_string_length) {
    operator_delete(local_288._M_p,broadcast._M_string_length + 1);
  }
  if (iVar6 == -1) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&containerIp.field_2 + 8),"Create namespace ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    plVar7 = (long *)std::__cxx11::string::append(containerIp.field_2._M_local_buf + 8);
    local_288._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_288._M_p == psVar10) {
      broadcast._M_string_length = *psVar10;
      broadcast.field_2._M_allocated_capacity = plVar7[3];
      local_288._M_p = (pointer)&broadcast._M_string_length;
    }
    else {
      broadcast._M_string_length = *psVar10;
    }
    broadcast._M_dataplus._M_p = (pointer)plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar9,(string *)&stack0xfffffffffffffd78);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sem_post(__sem);
  sem_wait(local_38);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vEthPair.second.field_2 + 8),"ip link add ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  plVar7 = (long *)std::__cxx11::string::append(vEthPair.second.field_2._M_local_buf + 8);
  containerIp.field_2._8_8_ = &bridgeFilePath._M_string_length;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    bridgeFilePath._M_string_length = *psVar10;
    bridgeFilePath.field_2._M_allocated_capacity = plVar7[3];
  }
  else {
    bridgeFilePath._M_string_length = *psVar10;
    containerIp.field_2._8_8_ = (size_type *)*plVar7;
  }
  bridgeFilePath._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             (containerIp.field_2._M_local_buf + 8,vEthPair.first.field_2._8_8_);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    broadcast._M_string_length = *psVar10;
    broadcast.field_2._M_allocated_capacity = plVar7[3];
    local_288._M_p = (pointer)&broadcast._M_string_length;
  }
  else {
    broadcast._M_string_length = *psVar10;
    local_288._M_p = (pointer)*plVar7;
  }
  broadcast._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::operator+(&local_88,"ip link set ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_68.field_2._M_allocated_capacity = *psVar10;
    local_68.field_2._8_8_ = plVar7[3];
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar10;
    local_68._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_68._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_188);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&vEthPair.first.field_2 + 8);
  broadcast.field_2._8_8_ = &local_258;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_258 = *plVar8;
    sStack_250 = plVar7[3];
  }
  else {
    local_258 = *plVar8;
    broadcast.field_2._8_8_ = (long *)*plVar7;
  }
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::operator+(&local_428,"ip link set ",__rhs);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_428);
  bridgeFilePath.field_2._8_8_ = &local_a0;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    local_a0._M_allocated_capacity = *psVar10;
    local_a0._8_8_ = plVar7[3];
  }
  else {
    local_a0._M_allocated_capacity = *psVar10;
    bridgeFilePath.field_2._8_8_ = (size_type *)*plVar7;
  }
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             (bridgeFilePath.field_2._M_local_buf + 8,
                              (ulong)BRIDGE_NAME_abi_cxx11_._M_dataplus._M_p);
  local_248 = &local_238;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_238 = *plVar8;
    lStack_230 = plVar7[3];
  }
  else {
    local_238 = *plVar8;
    local_248 = (long *)*plVar7;
  }
  local_240 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::operator+(&local_408,"ip netns exec ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_408);
  local_2a8 = &local_298;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_298 = *plVar8;
    lStack_290 = plVar7[3];
  }
  else {
    local_298 = *plVar8;
    local_2a8 = (long *)*plVar7;
  }
  local_2a0 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2a8,command.field_2._8_8_);
  local_2c8 = &local_2b8;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_2b8 = *plVar8;
    lStack_2b0 = plVar7[3];
  }
  else {
    local_2b8 = *plVar8;
    local_2c8 = (long *)*plVar7;
  }
  local_2c0 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  local_2e8 = &local_2d8;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_2d8 = *plVar8;
    lStack_2d0 = plVar7[3];
  }
  else {
    local_2d8 = *plVar8;
    local_2e8 = (long *)*plVar7;
  }
  local_2e0 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2e8,
                              (ulong)commands.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_228 = &local_218;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_218 = *plVar8;
    lStack_210 = plVar7[3];
  }
  else {
    local_218 = *plVar8;
    local_228 = (long *)*plVar7;
  }
  local_220 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::operator+(&local_3e8,"ip netns exec ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3e8);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_318 = *plVar8;
    lStack_310 = plVar7[3];
    local_328 = &local_318;
  }
  else {
    local_318 = *plVar8;
    local_328 = (long *)*plVar7;
  }
  local_320 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_328,
                              (ulong)commands.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_338 = *plVar8;
    lStack_330 = plVar7[3];
    suffix.field_2._8_8_ = &local_338;
  }
  else {
    local_338 = *plVar8;
    suffix.field_2._8_8_ = (long *)*plVar7;
  }
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(suffix.field_2._M_local_buf + 8);
  local_208 = &local_1f8;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_1f8 = *plVar8;
    lStack_1f0 = plVar7[3];
  }
  else {
    local_1f8 = *plVar8;
    local_208 = (long *)*plVar7;
  }
  local_200 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::operator+(&local_3c8,"ip netns exec ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c8);
  local_1e8 = &local_1d8;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_1d8 = *plVar8;
    lStack_1d0 = plVar7[3];
  }
  else {
    local_1d8 = *plVar8;
    local_1e8 = (long *)*plVar7;
  }
  local_1e0 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::operator+(&local_3a8,"ip link set ",__rhs);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  local_1c8 = &local_1b8;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_1b8 = *plVar8;
    lStack_1b0 = plVar7[3];
  }
  else {
    local_1b8 = *plVar8;
    local_1c8 = (long *)*plVar7;
  }
  local_1c0 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::operator+(&local_388,"ip netns exec ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_2f8 = *plVar8;
    lStack_2f0 = plVar7[3];
    local_308 = &local_2f8;
  }
  else {
    local_2f8 = *plVar8;
    local_308 = (long *)*plVar7;
  }
  local_300 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_308,(ulong)BRIDGE_IP_abi_cxx11_._M_dataplus._M_p);
  plVar7 = local_198;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_198[0] = *plVar11;
    local_198[1] = plVar8[3];
    local_1a8 = plVar7;
  }
  else {
    local_198[0] = *plVar11;
    local_1a8 = (long *)*plVar8;
  }
  local_1a0 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  __l._M_len = 8;
  __l._M_array = (iterator)&stack0xfffffffffffffd78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&newNetworkNs.field_2 + 8),__l,&local_89);
  lVar15 = -0x100;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -4;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  psVar10 = &bridgeFilePath._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((long *)suffix.field_2._8_8_ != &local_338) {
    operator_delete((void *)suffix.field_2._8_8_,local_338 + 1);
  }
  psVar13 = &broadcast._M_string_length;
  if (local_328 != &local_318) {
    operator_delete(local_328,local_318 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bridgeFilePath.field_2._8_8_ != &local_a0) {
    operator_delete((void *)bridgeFilePath.field_2._8_8_,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((size_type *)containerIp.field_2._8_8_ != psVar10) {
    operator_delete((void *)containerIp.field_2._8_8_,bridgeFilePath._M_string_length + 1);
  }
  psVar2 = &command._M_string_length;
  if ((size_type *)vEthPair.second.field_2._8_8_ != psVar2) {
    operator_delete((void *)vEthPair.second.field_2._8_8_,command._M_string_length + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffd78,"/sys/class/net/",&BRIDGE_NAME_abi_cxx11_);
  plVar7 = (long *)std::__cxx11::string::append((char *)&stack0xfffffffffffffd78);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar12) {
    bridgeFilePath._M_string_length = *psVar12;
    bridgeFilePath.field_2._M_allocated_capacity = plVar7[3];
    containerIp.field_2._8_8_ = psVar10;
  }
  else {
    bridgeFilePath._M_string_length = *psVar12;
    containerIp.field_2._8_8_ = (size_type *)*plVar7;
  }
  bridgeFilePath._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((size_type *)local_288._M_p != psVar13) {
    operator_delete(local_288._M_p,broadcast._M_string_length + 1);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&stack0xfffffffffffffd78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&containerIp.field_2 + 8),auto_format);
  cVar4 = std::filesystem::status((path *)&stack0xfffffffffffffd78);
  std::filesystem::__cxx11::path::~path((path *)&stack0xfffffffffffffd78);
  uVar14 = newNetworkNs.field_2._8_8_;
  if ((cVar4 == -1) || (cVar4 == '\0')) {
    local_288._M_p = (pointer)psVar13;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffd78,"iptables --policy FORWARD ACCEPT","");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&newNetworkNs.field_2 + 8),(const_iterator)uVar14,
                     (value_type *)&stack0xfffffffffffffd78);
    if ((size_type *)local_288._M_p != psVar13) {
      operator_delete(local_288._M_p,broadcast._M_string_length + 1);
    }
    local_288._M_p = (pointer)psVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xfffffffffffffd78,BRIDGE_IP_abi_cxx11_._M_dataplus._M_p,
               BRIDGE_IP_abi_cxx11_._M_dataplus._M_p + BRIDGE_IP_abi_cxx11_._M_string_length);
    std::__cxx11::string::pop_back();
    std::__cxx11::string::push_back((char)&stack0xfffffffffffffd78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bridgeFilePath.field_2 + 8),"iptables -t nat -A POSTROUTING -s ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffd78);
    plVar7 = (long *)std::__cxx11::string::append(bridgeFilePath.field_2._M_local_buf + 8);
    psVar13 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_88.field_2._M_allocated_capacity = *psVar13;
      local_88.field_2._8_8_ = plVar7[3];
      local_88._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar13;
      local_88._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_88._M_string_length = plVar7[1];
    *plVar7 = (long)psVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_88,(ulong)BRIDGE_NAME_abi_cxx11_._M_dataplus._M_p);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    psVar13 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_68.field_2._M_allocated_capacity = *psVar13;
      local_68.field_2._8_8_ = plVar7[3];
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar13;
      local_68._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_68._M_string_length = plVar7[1];
    *plVar7 = (long)psVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_68);
    psVar13 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar13) {
      command._M_string_length = *psVar13;
      command.field_2._M_allocated_capacity = plVar7[3];
      vEthPair.second.field_2._8_8_ = psVar2;
    }
    else {
      command._M_string_length = *psVar13;
      vEthPair.second.field_2._8_8_ = (size_type *)*plVar7;
    }
    command._M_dataplus._M_p = (pointer)plVar7[1];
    *plVar7 = (long)psVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bridgeFilePath.field_2._8_8_ != &local_a0) {
      operator_delete((void *)bridgeFilePath.field_2._8_8_,local_a0._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&newNetworkNs.field_2 + 8),(const_iterator)newNetworkNs.field_2._8_8_,
             (value_type *)((long)&vEthPair.second.field_2 + 8));
    uVar14 = newNetworkNs.field_2._8_8_;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bridgeFilePath.field_2 + 8),"ip addr add ",&BRIDGE_IP_abi_cxx11_);
    plVar7 = (long *)std::__cxx11::string::append(bridgeFilePath.field_2._M_local_buf + 8);
    psVar13 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_88.field_2._M_allocated_capacity = *psVar13;
      local_88.field_2._8_8_ = plVar7[3];
      local_88._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar13;
      local_88._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_88._M_string_length = plVar7[1];
    *plVar7 = (long)psVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_88,(ulong)BRIDGE_NAME_abi_cxx11_._M_dataplus._M_p);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    psVar13 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_68.field_2._M_allocated_capacity = *psVar13;
      local_68.field_2._8_8_ = plVar7[3];
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar13;
      local_68._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_68._M_string_length = plVar7[1];
    *plVar7 = (long)psVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&newNetworkNs.field_2 + 8),(const_iterator)uVar14,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bridgeFilePath.field_2._8_8_ != &local_a0) {
      operator_delete((void *)bridgeFilePath.field_2._8_8_,local_a0._M_allocated_capacity + 1);
    }
    uVar14 = newNetworkNs.field_2._8_8_;
    std::operator+(&local_88,"ip link set ",&BRIDGE_NAME_abi_cxx11_);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    psVar13 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_68.field_2._M_allocated_capacity = *psVar13;
      local_68.field_2._8_8_ = plVar7[3];
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar13;
      local_68._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_68._M_string_length = plVar7[1];
    *plVar7 = (long)psVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&newNetworkNs.field_2 + 8),(const_iterator)uVar14,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    uVar14 = newNetworkNs.field_2._8_8_;
    std::operator+(&local_88,"ip link add name ",&BRIDGE_NAME_abi_cxx11_);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    psVar13 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_68.field_2._M_allocated_capacity = *psVar13;
      local_68.field_2._8_8_ = plVar7[3];
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar13;
      local_68._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_68._M_string_length = plVar7[1];
    *plVar7 = (long)psVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&newNetworkNs.field_2 + 8),(const_iterator)uVar14,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((size_type *)vEthPair.second.field_2._8_8_ != psVar2) {
      operator_delete((void *)vEthPair.second.field_2._8_8_,command._M_string_length + 1);
    }
    uVar14 = newNetworkNs.field_2._8_8_;
    if ((size_type *)local_288._M_p != &broadcast._M_string_length) {
      operator_delete(local_288._M_p,broadcast._M_string_length + 1);
      uVar14 = newNetworkNs.field_2._8_8_;
    }
  }
  while( true ) {
    if ((pointer)uVar14 ==
        commands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sem_post(local_38);
      VVar5 = loguru::current_verbosity_cutoff();
      if (-1 < VVar5) {
        loguru::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      }
      if ((size_type *)containerIp.field_2._8_8_ != psVar10) {
        operator_delete((void *)containerIp.field_2._8_8_,bridgeFilePath._M_string_length + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&newNetworkNs.field_2 + 8));
      if ((size_type *)command.field_2._8_8_ != &containerIp._M_string_length) {
        operator_delete((void *)command.field_2._8_8_,
                        CONCAT71(containerIp._M_string_length._1_7_,
                                 (undefined1)containerIp._M_string_length) + 1);
      }
      if ((size_type *)vEthPair.first.field_2._8_8_ != &vEthPair.second._M_string_length) {
        operator_delete((void *)vEthPair.first.field_2._8_8_,vEthPair.second._M_string_length + 1);
      }
      if (commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          (pointer)&vEthPair.first._M_string_length) {
        operator_delete(commands.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        CONCAT71(vEthPair.first._M_string_length._1_7_,
                                 (undefined1)vEthPair.first._M_string_length) + 1);
      }
      if (local_368 != (undefined1  [8])&suffix._M_string_length) {
        operator_delete((void *)local_368,suffix._M_string_length + 1);
      }
      if (local_188 != (undefined1  [8])&newNetworkNs._M_string_length) {
        operator_delete((void *)local_188,newNetworkNs._M_string_length + 1);
      }
      return;
    }
    iVar6 = system((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar14)->
                   _M_dataplus)._M_p);
    if (iVar6 == -1) break;
    uVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar14 + 0x20);
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vEthPair.second.field_2 + 8),"Execute command ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar14);
  plVar7 = (long *)std::__cxx11::string::append(vEthPair.second.field_2._M_local_buf + 8);
  local_288._M_p = (pointer)*plVar7;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_288._M_p == psVar10) {
    broadcast._M_string_length = *psVar10;
    broadcast.field_2._M_allocated_capacity = plVar7[3];
    local_288._M_p = (pointer)&broadcast._M_string_length;
  }
  else {
    broadcast._M_string_length = *psVar10;
  }
  broadcast._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::runtime_error::runtime_error(prVar9,(string *)&stack0xfffffffffffffd78);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void initializeContainerNetwork(Container* container)
{
    LOG_F(INFO, "Initializing container network environment");
    try
    {
        auto* networkNsSemaphore = sem_open(NETWORK_NS_SEM_NAME, 0);
        if (networkNsSemaphore == SEM_FAILED)
            throw std::runtime_error("sem_open failed for " + std::string(NETWORK_NS_SEM_NAME));
        auto* networkInitSemaphore = sem_open(NETWORK_INIT_SEM_NAME, 0);
        if (networkInitSemaphore == SEM_FAILED)
            throw std::runtime_error("sem_open failed for " + std::string(NETWORK_INIT_SEM_NAME));

        std::string newNetworkNs = container->id;
        // Takes the first 9 characters of the container's ID as the suffix
        // for the names of the veth pair since a valid interface name contains
        // less than 16 characters
        std::string suffix = container->id.substr(0, 9);
        container->vEthPair = std::make_pair("veth0@" + suffix, "veth1@" + suffix);
        auto vEthPair = container->vEthPair;

        std::string containerIp = getContainerVEthIp();
        if (containerIp.empty())
            throw std::runtime_error("Obtain IPv4 address for container: FAILED");
        LOG_F(INFO, "Container IP: %s", containerIp.c_str());

        // Adds the container's ID as a new network namespace
        if (system(("ip netns add " + newNetworkNs).c_str()) == -1)
            throw std::runtime_error("Create namespace " + newNetworkNs + ": FAILED");
        // Unblocks the thread that is attempting to mount /var/run/netns/<new-network-ns>
        sem_post(networkNsSemaphore);
//        sem_post(sem_open(NETWORK_NS_SEM_NAME, 0));
        // Blocks itself until the container's registers its namespace in setUpNetworkNamespace()
        sem_wait(networkInitSemaphore);
//        sem_wait(sem_open(NETWORK_INIT_SEM_NAME, 0));
        std::vector<std::string> commands = {
                // Creates a veth pair
                "ip link add " +  vEthPair.first + " type veth peer name " + vEthPair.second,
                // Moves one end of the veth pair to the new namespace
                "ip link set " + vEthPair.first + " netns " + newNetworkNs,
                // Moves the other end of the veth pair to the bridge
                "ip link set " + vEthPair.second + " master " + BRIDGE_NAME,
                // Assigns an IPv4 address to the first interface in the veth pair
                "ip netns exec " + newNetworkNs + " ip addr add " + containerIp + "/24 dev " + vEthPair.first,
                // Ups veth0
                "ip netns exec " + newNetworkNs + " ip link set " + vEthPair.first + " up",
                // Ups the container's localhost
                "ip netns exec " + newNetworkNs + " ip link set lo up",
                // Ups veth1
                "ip link set " + vEthPair.second + " up",
                // Adds the bridge as the default gateway
                "ip netns exec " + newNetworkNs + " ip route add default via " + BRIDGE_IP
        };

        // Checks if the bridge 'kapsel' already exists
        std::string bridgeFilePath = "/sys/class/net/" + BRIDGE_NAME + "/bridge";
        if (!std::filesystem::exists(bridgeFilePath))
        {
            // Changes the policy on IP table
            // FIXME There might exist another solution
            // From: https://serverfault.com/questions/694889/cannot-ping-linux-network-namespace-within-the-same-subnet
            commands.insert(commands.begin(), "iptables --policy FORWARD ACCEPT");
            // Enable sending requests and getting responses to/from internet
            // From: https://dev.to/polarbit/how-docker-container-networking-works-mimic-it-using-linux-network-namespaces-9mj
            std::string broadcast = BRIDGE_IP;
            broadcast.pop_back();
            broadcast.push_back('1');
            std::string command = "iptables -t nat -A POSTROUTING -s " + broadcast + "/24 ! -o " + BRIDGE_NAME + " -j MASQUERADE";
            commands.insert(commands.begin(), command);
            // Assigns an IP address to the bridge
            commands.insert(commands.begin(), "ip addr add " + BRIDGE_IP + "/24 brd + dev " + BRIDGE_NAME);
            // Ups the bridge interface
            commands.insert(commands.begin(), "ip link set " + BRIDGE_NAME + " up");
            // Creates a network bridge
            commands.insert(commands.begin(), "ip link add name " + BRIDGE_NAME + " type bridge");
        }

        for (const auto& command : commands)
        {
            if (system(command.c_str()) == -1)
                throw std::runtime_error("Execute command " + command + ": FAILED");
        }

        sem_post(networkInitSemaphore);
//        sem_post(sem_open(NETWORK_NS_SEM_NAME, 0));
        LOG_F(INFO, "Initialize container network environment: SUCCESS");
    }
    catch (std::exception& ex)
    {
        LOG_F(ERROR, "Initialize container network environment: FAILED");
        LOG_F(ERROR, "%s", ex.what());
    }
}